

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O1

void device_reset_gameboy_sound(void *chip)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  gb_sound_t *gb;
  byte bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  byte bVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  
  bVar1 = *(byte *)((long)chip + 0x3e);
  bVar13 = *(char *)((long)chip + 0x72) * '\x02' | bVar1;
  bVar5 = *(char *)((long)chip + 0xda) << 3 | *(char *)((long)chip + 0xa6) << 2 | bVar13;
  *(undefined8 *)((long)chip + 0x128) = 0;
  memset((void *)((long)chip + 0xc),0,0xd0);
  *(byte *)((long)chip + 0x3e) = bVar1 & 1;
  *(byte *)((long)chip + 0x72) = bVar13 >> 1 & 1;
  *(byte *)((long)chip + 0xa6) = bVar5 >> 2 & 1;
  *(byte *)((long)chip + 0xda) = bVar5 >> 3 & 1;
  *(undefined1 *)((long)chip + 0x12) = 1;
  *(undefined1 *)((long)chip + 0x14) = 0x3f;
  *(undefined1 *)((long)chip + 0x46) = 2;
  *(undefined1 *)((long)chip + 0x48) = 0x3f;
  *(undefined1 *)((long)chip + 0x7a) = 3;
  *(undefined1 *)((long)chip + 0x7c) = 0xff;
  *(undefined1 *)((long)chip + 0xae) = 4;
  *(undefined1 *)((long)chip + 0xb0) = 0x3f;
  gb_sound_w_internal((gb_sound_t *)chip,'\x16','\0');
  if (*(char *)((long)chip + 0x130) == '\0') {
    uVar8 = 0xe5;
    uVar9 = 4;
    uVar10 = 0x2c;
    uVar11 = 0x16;
    uVar12 = 0xcf;
    uVar6 = 2;
    uVar14 = 0x36;
    uVar3 = 0x48;
    uVar7 = 0xda;
    uVar2 = 0xdd;
    uVar4 = 0xac;
    uVar15 = 0x2c;
  }
  else {
    if (*(char *)((long)chip + 0x130) != '\x01') {
      return;
    }
    uVar2 = 0xff;
    uVar4 = 0;
    uVar7 = 0;
    uVar3 = 0xff;
    uVar14 = 0;
    uVar6 = 0xff;
    uVar12 = 0;
    uVar11 = 0xff;
    uVar10 = 0;
    uVar9 = 0xff;
    uVar8 = 0;
    uVar15 = 0xff;
  }
  *(undefined1 *)((long)chip + 0x110) = uVar4;
  *(undefined1 *)((long)chip + 0x111) = uVar2;
  *(undefined1 *)((long)chip + 0x112) = uVar7;
  *(undefined1 *)((long)chip + 0x113) = uVar3;
  *(undefined1 *)((long)chip + 0x114) = uVar14;
  *(undefined1 *)((long)chip + 0x115) = uVar6;
  *(undefined1 *)((long)chip + 0x116) = uVar12;
  *(undefined1 *)((long)chip + 0x117) = uVar11;
  *(undefined1 *)((long)chip + 0x118) = uVar10;
  *(undefined1 *)((long)chip + 0x119) = uVar9;
  *(undefined1 *)((long)chip + 0x11a) = uVar8;
  *(undefined1 *)((long)chip + 0x11b) = uVar15;
  *(undefined1 *)((long)chip + 0x11c) = uVar4;
  *(undefined1 *)((long)chip + 0x11d) = uVar2;
  *(undefined1 *)((long)chip + 0x11e) = uVar7;
  *(undefined1 *)((long)chip + 0x11f) = uVar3;
  return;
}

Assistant:

static void device_reset_gameboy_sound(void *chip)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	UINT32 muteMask;

	muteMask = gameboy_sound_get_mute_mask(gb);

	RC_RESET(&gb->cycleCntr);

	memset(&gb->snd_1, 0, sizeof(gb->snd_1));
	memset(&gb->snd_2, 0, sizeof(gb->snd_2));
	memset(&gb->snd_3, 0, sizeof(gb->snd_3));
	memset(&gb->snd_4, 0, sizeof(gb->snd_4));

	gameboy_sound_set_mute_mask(gb, muteMask);

	gb->snd_1.channel = 1;
	gb->snd_1.length_mask = 0x3F;
	gb->snd_2.channel = 2;
	gb->snd_2.length_mask = 0x3F;
	gb->snd_3.channel = 3;
	gb->snd_3.length_mask = 0xFF;
	gb->snd_4.channel = 4;
	gb->snd_4.length_mask = 0x3F;

	gb_sound_w_internal(gb, NR52, 0x00);
	switch(gb->gbMode)
	{
	case GBMODE_DMG:
		gb->snd_regs[AUD3W0] = 0xac;
		gb->snd_regs[AUD3W1] = 0xdd;
		gb->snd_regs[AUD3W2] = 0xda;
		gb->snd_regs[AUD3W3] = 0x48;
		gb->snd_regs[AUD3W4] = 0x36;
		gb->snd_regs[AUD3W5] = 0x02;
		gb->snd_regs[AUD3W6] = 0xcf;
		gb->snd_regs[AUD3W7] = 0x16;
		gb->snd_regs[AUD3W8] = 0x2c;
		gb->snd_regs[AUD3W9] = 0x04;
		gb->snd_regs[AUD3WA] = 0xe5;
		gb->snd_regs[AUD3WB] = 0x2c;
		gb->snd_regs[AUD3WC] = 0xac;
		gb->snd_regs[AUD3WD] = 0xdd;
		gb->snd_regs[AUD3WE] = 0xda;
		gb->snd_regs[AUD3WF] = 0x48;
		break;
	case GBMODE_CGB04:
		gb->snd_regs[AUD3W0] = 0x00;
		gb->snd_regs[AUD3W1] = 0xFF;
		gb->snd_regs[AUD3W2] = 0x00;
		gb->snd_regs[AUD3W3] = 0xFF;
		gb->snd_regs[AUD3W4] = 0x00;
		gb->snd_regs[AUD3W5] = 0xFF;
		gb->snd_regs[AUD3W6] = 0x00;
		gb->snd_regs[AUD3W7] = 0xFF;
		gb->snd_regs[AUD3W8] = 0x00;
		gb->snd_regs[AUD3W9] = 0xFF;
		gb->snd_regs[AUD3WA] = 0x00;
		gb->snd_regs[AUD3WB] = 0xFF;
		gb->snd_regs[AUD3WC] = 0x00;
		gb->snd_regs[AUD3WD] = 0xFF;
		gb->snd_regs[AUD3WE] = 0x00;
		gb->snd_regs[AUD3WF] = 0xFF;
		break;
	}

	return;
}